

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InstructionFolder::FoldBinaryIntegerOpToConstant
          (InstructionFolder *this,Instruction *inst,function<unsigned_int_(unsigned_int)> *id_map,
          uint32_t *result)

{
  Op OVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  int32_t iVar5;
  ConstantManager *this_00;
  Operand *pOVar6;
  uint *puVar7;
  Constant *pCVar8;
  undefined4 extraout_var;
  ulong uVar9;
  undefined8 local_a0;
  uint local_88;
  uint32_t i_4;
  uint32_t mask;
  uint32_t i_3;
  uint32_t shift_amount;
  uint32_t i_2;
  uint32_t i_1;
  Constant *constant;
  Operand *operand;
  ScalarConstant *pSStack_58;
  uint32_t i;
  IntConstant *constants [2];
  uint32_t ids [2];
  ConstantManager *const_manger;
  Op opcode;
  uint32_t *result_local;
  function<unsigned_int_(unsigned_int)> *id_map_local;
  Instruction *inst_local;
  InstructionFolder *this_local;
  
  OVar1 = opt::Instruction::opcode(inst);
  this_00 = IRContext::get_constant_mgr(this->context_);
  for (operand._4_4_ = 0; operand._4_4_ < 2; operand._4_4_ = operand._4_4_ + 1) {
    pOVar6 = opt::Instruction::GetInOperand(inst,operand._4_4_);
    if (pOVar6->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    puVar7 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar6->words,0);
    uVar2 = std::function<unsigned_int_(unsigned_int)>::operator()(id_map,*puVar7);
    ids[(ulong)operand._4_4_ - 2] = uVar2;
    pCVar8 = analysis::ConstantManager::FindDeclaredConstant(this_00,ids[(ulong)operand._4_4_ - 2]);
    if (pCVar8 == (Constant *)0x0) {
      local_a0 = 0;
    }
    else {
      iVar3 = (*pCVar8->_vptr_Constant[0xe])();
      local_a0 = CONCAT44(extraout_var,iVar3);
    }
    *(undefined8 *)((long)&stack0xffffffffffffffa8 + (ulong)operand._4_4_ * 8) = local_a0;
  }
  switch(OVar1) {
  case OpIMul:
    for (shift_amount = 0; shift_amount < 2; shift_amount = shift_amount + 1) {
      if ((*(long *)((long)&stack0xffffffffffffffa8 + (ulong)shift_amount * 8) != 0) &&
         (uVar9 = (**(code **)(**(long **)((long)&stack0xffffffffffffffa8 + (ulong)shift_amount * 8)
                              + 0xb8))(), (uVar9 & 1) != 0)) {
        *result = 0;
        return true;
      }
    }
    break;
  default:
    break;
  case OpUDiv:
  case OpSDiv:
  case OpUMod:
  case OpSRem:
  case OpSMod:
    for (i_3 = 0; i_3 < 2; i_3 = i_3 + 1) {
      if ((*(long *)((long)&stack0xffffffffffffffa8 + (ulong)i_3 * 8) != 0) &&
         (uVar9 = (**(code **)(**(long **)((long)&stack0xffffffffffffffa8 + (ulong)i_3 * 8) + 0xb8))
                            (), (uVar9 & 1) != 0)) {
        *result = 0;
        return true;
      }
    }
    break;
  case OpUGreaterThan:
    if ((pSStack_58 != (ScalarConstant *)0x0) &&
       (uVar2 = (*(pSStack_58->super_Constant)._vptr_Constant[0x17])(), (uVar2 & 1) != 0)) {
      *result = 0;
      return true;
    }
    if ((constants[0] != (IntConstant *)0x0) &&
       (uVar4 = analysis::ScalarConstant::GetU32BitValue(&constants[0]->super_ScalarConstant),
       uVar4 == 0xffffffff)) {
      *result = 0;
      return true;
    }
    break;
  case OpSGreaterThan:
    if ((pSStack_58 != (ScalarConstant *)0x0) &&
       (iVar5 = analysis::IntConstant::GetS32BitValue((IntConstant *)pSStack_58),
       iVar5 == -0x80000000)) {
      *result = 0;
      return true;
    }
    if ((constants[0] != (IntConstant *)0x0) &&
       (iVar5 = analysis::IntConstant::GetS32BitValue(constants[0]), iVar5 == 0x7fffffff)) {
      *result = 0;
      return true;
    }
    break;
  case OpUGreaterThanEqual:
    if ((pSStack_58 != (ScalarConstant *)0x0) &&
       (uVar4 = analysis::ScalarConstant::GetU32BitValue(pSStack_58), uVar4 == 0xffffffff)) {
      *result = 1;
      return true;
    }
    if ((constants[0] != (IntConstant *)0x0) &&
       (uVar4 = analysis::ScalarConstant::GetU32BitValue(&constants[0]->super_ScalarConstant),
       uVar4 == 0)) {
      *result = 1;
      return true;
    }
    break;
  case OpSGreaterThanEqual:
    if ((pSStack_58 != (ScalarConstant *)0x0) &&
       (iVar5 = analysis::IntConstant::GetS32BitValue((IntConstant *)pSStack_58),
       iVar5 == 0x7fffffff)) {
      *result = 1;
      return true;
    }
    if ((constants[0] != (IntConstant *)0x0) &&
       (iVar5 = analysis::IntConstant::GetS32BitValue(constants[0]), iVar5 == -0x80000000)) {
      *result = 1;
      return true;
    }
    break;
  case OpULessThan:
    if ((pSStack_58 != (ScalarConstant *)0x0) &&
       (uVar4 = analysis::ScalarConstant::GetU32BitValue(pSStack_58), uVar4 == 0xffffffff)) {
      *result = 0;
      return true;
    }
    if ((constants[0] != (IntConstant *)0x0) &&
       (uVar4 = analysis::ScalarConstant::GetU32BitValue(&constants[0]->super_ScalarConstant),
       uVar4 == 0)) {
      *result = 0;
      return true;
    }
    break;
  case OpSLessThan:
    if ((pSStack_58 != (ScalarConstant *)0x0) &&
       (iVar5 = analysis::IntConstant::GetS32BitValue((IntConstant *)pSStack_58),
       iVar5 == 0x7fffffff)) {
      *result = 0;
      return true;
    }
    if ((constants[0] != (IntConstant *)0x0) &&
       (iVar5 = analysis::IntConstant::GetS32BitValue(constants[0]), iVar5 == -0x80000000)) {
      *result = 0;
      return true;
    }
    break;
  case OpULessThanEqual:
    if ((pSStack_58 != (ScalarConstant *)0x0) &&
       (uVar2 = (*(pSStack_58->super_Constant)._vptr_Constant[0x17])(), (uVar2 & 1) != 0)) {
      *result = 1;
      return true;
    }
    if ((constants[0] != (IntConstant *)0x0) &&
       (uVar4 = analysis::ScalarConstant::GetU32BitValue(&constants[0]->super_ScalarConstant),
       uVar4 == 0xffffffff)) {
      *result = 1;
      return true;
    }
    break;
  case OpSLessThanEqual:
    if ((pSStack_58 != (ScalarConstant *)0x0) &&
       (iVar5 = analysis::IntConstant::GetS32BitValue((IntConstant *)pSStack_58),
       iVar5 == -0x80000000)) {
      *result = 1;
      return true;
    }
    if ((constants[0] != (IntConstant *)0x0) &&
       (iVar5 = analysis::IntConstant::GetS32BitValue(constants[0]), iVar5 == 0x7fffffff)) {
      *result = 1;
      return true;
    }
    break;
  case OpShiftRightLogical:
  case OpShiftLeftLogical:
    if ((constants[0] != (IntConstant *)0x0) &&
       (uVar4 = analysis::ScalarConstant::GetU32BitValue(&constants[0]->super_ScalarConstant),
       0x1f < uVar4)) {
      *result = 0;
      return true;
    }
    break;
  case OpBitwiseOr:
    for (i_4 = 0; i_4 < 2; i_4 = i_4 + 1) {
      if ((*(long *)((long)&stack0xffffffffffffffa8 + (ulong)i_4 * 8) != 0) &&
         (uVar4 = analysis::ScalarConstant::GetU32BitValue
                            (*(ScalarConstant **)((long)&stack0xffffffffffffffa8 + (ulong)i_4 * 8)),
         uVar4 == 0xffffffff)) {
        *result = 0xffffffff;
        return true;
      }
    }
    break;
  case OpBitwiseAnd:
    for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
      if ((*(long *)((long)&stack0xffffffffffffffa8 + (ulong)local_88 * 8) != 0) &&
         (uVar9 = (**(code **)(**(long **)((long)&stack0xffffffffffffffa8 + (ulong)local_88 * 8) +
                              0xb8))(), (uVar9 & 1) != 0)) {
        *result = 0;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool InstructionFolder::FoldBinaryIntegerOpToConstant(
    Instruction* inst, const std::function<uint32_t(uint32_t)>& id_map,
    uint32_t* result) const {
  spv::Op opcode = inst->opcode();
  analysis::ConstantManager* const_manger = context_->get_constant_mgr();

  uint32_t ids[2];
  const analysis::IntConstant* constants[2];
  for (uint32_t i = 0; i < 2; i++) {
    const Operand* operand = &inst->GetInOperand(i);
    if (operand->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ids[i] = id_map(operand->words[0]);
    const analysis::Constant* constant =
        const_manger->FindDeclaredConstant(ids[i]);
    constants[i] = (constant != nullptr ? constant->AsIntConstant() : nullptr);
  }

  switch (opcode) {
    // Arthimetics
    case spv::Op::OpIMul:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr && constants[i]->IsZero()) {
          *result = 0;
          return true;
        }
      }
      break;
    case spv::Op::OpUDiv:
    case spv::Op::OpSDiv:
    case spv::Op::OpSRem:
    case spv::Op::OpSMod:
    case spv::Op::OpUMod:
      // This changes undefined behaviour (ie divide by 0) into a 0.
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr && constants[i]->IsZero()) {
          *result = 0;
          return true;
        }
      }
      break;

    // Shifting
    case spv::Op::OpShiftRightLogical:
    case spv::Op::OpShiftLeftLogical:
      if (constants[1] != nullptr) {
        // When shifting by a value larger than the size of the result, the
        // result is undefined.  We are setting the undefined behaviour to a
        // result of 0.  If the shift amount is the same as the size of the
        // result, then the result is defined, and it 0.
        uint32_t shift_amount = constants[1]->GetU32BitValue();
        if (shift_amount >= 32) {
          *result = 0;
          return true;
        }
      }
      break;

    // Bitwise operations
    case spv::Op::OpBitwiseOr:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          // TODO: Change the mask against a value based on the bit width of the
          // instruction result type.  This way we can handle say 16-bit values
          // as well.
          uint32_t mask = constants[i]->GetU32BitValue();
          if (mask == 0xFFFFFFFF) {
            *result = 0xFFFFFFFF;
            return true;
          }
        }
      }
      break;
    case spv::Op::OpBitwiseAnd:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          if (constants[i]->IsZero()) {
            *result = 0;
            return true;
          }
        }
      }
      break;

    // Comparison
    case spv::Op::OpULessThan:
      if (constants[0] != nullptr &&
          constants[0]->GetU32BitValue() == UINT32_MAX) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr && constants[1]->GetU32BitValue() == 0) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpSLessThan:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MAX) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MIN) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpUGreaterThan:
      if (constants[0] != nullptr && constants[0]->IsZero()) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetU32BitValue() == UINT32_MAX) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpSGreaterThan:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MIN) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MAX) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpULessThanEqual:
      if (constants[0] != nullptr && constants[0]->IsZero()) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetU32BitValue() == UINT32_MAX) {
        *result = true;
        return true;
      }
      break;
    case spv::Op::OpSLessThanEqual:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MIN) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MAX) {
        *result = true;
        return true;
      }
      break;
    case spv::Op::OpUGreaterThanEqual:
      if (constants[0] != nullptr &&
          constants[0]->GetU32BitValue() == UINT32_MAX) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr && constants[1]->GetU32BitValue() == 0) {
        *result = true;
        return true;
      }
      break;
    case spv::Op::OpSGreaterThanEqual:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MAX) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MIN) {
        *result = true;
        return true;
      }
      break;
    default:
      break;
  }
  return false;
}